

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O0

void __thiscall PacketProcessor::restart(PacketProcessor *this,uint32_t pos)

{
  size_type sVar1;
  const_iterator __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  uint local_14;
  PacketProcessor *pPStack_10;
  uint32_t pos_local;
  PacketProcessor *this_local;
  
  local_14 = pos;
  pPStack_10 = this;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
  if (local_14 <= sVar1) {
    local_28._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin(&this->buffer_)
    ;
    local_20 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_28,(ulong)local_14);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend(&this->buffer_);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,local_20,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    this->findHeader_ = false;
    this->dataSize_ = 0;
    tryUnpack(this);
    return;
  }
  __assert_fail("buffer_.size() >= pos",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shuai132[P]PacketProcessor/PacketProcessor.cpp"
                ,0x10c,"void PacketProcessor::restart(uint32_t)");
}

Assistant:

void PacketProcessor::restart(uint32_t pos) {
  PacketProcessor_LOGV("restart: pos=%u,  buffer_.size()=%zu", pos, buffer_.size());
  assert(buffer_.size() >= pos);

  buffer_.assign(buffer_.cbegin() + pos, buffer_.cend());

  findHeader_ = false;
  dataSize_ = 0;

  // 每次解包成功后 要继续尝试解包 因为缓冲可能包含多个包
  tryUnpack();
}